

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O3

void beltBlockDecr(octet *block,u32 *key)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  uVar5 = key[7] + *(int *)block;
  uVar2 = H13[uVar5 >> 8 & 0xff] ^ H5[uVar5 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^
          *(uint *)(block + 4);
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[6] + *(int *)(block + 0xc);
  uVar6 = H29[uVar5 >> 8 & 0xff] ^ H21[uVar5 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^
          *(uint *)(block + 8);
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[5] + uVar2;
  uVar1 = *(int *)block -
          (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)block = uVar1;
  *(uint *)(block + 8) = uVar6 + uVar2;
  uVar5 = uVar6 + uVar2 + key[4];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 8;
  uVar2 = uVar2 + uVar5;
  *(uint *)(block + 4) = uVar2;
  uVar6 = uVar6 - uVar5;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[3] + uVar6;
  uVar4 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) +
          *(int *)(block + 0xc);
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[2] + uVar1;
  uVar2 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[1] + uVar4;
  uVar6 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = *key + uVar6;
  uVar1 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[7] + uVar2;
  uVar4 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[6] + uVar1;
  uVar6 = uVar6 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)(block + 8) = uVar6;
  *(uint *)(block + 0xc) = uVar4 + uVar1;
  uVar5 = uVar4 + uVar1 + key[5];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 7;
  uVar1 = uVar1 + uVar5;
  *(uint *)block = uVar1;
  uVar4 = uVar4 - uVar5;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[4] + uVar4;
  uVar2 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[3] + uVar6;
  uVar1 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[2] + uVar2;
  uVar4 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[1] + uVar4;
  uVar6 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = *key + uVar1;
  uVar2 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[7] + uVar6;
  uVar4 = uVar4 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)(block + 0xc) = uVar4;
  *(uint *)(block + 4) = uVar2 + uVar6;
  uVar5 = uVar2 + uVar6 + key[6];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 6;
  uVar6 = uVar6 + uVar5;
  *(uint *)(block + 8) = uVar6;
  uVar2 = uVar2 - uVar5;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[5] + uVar2;
  uVar1 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[4] + uVar4;
  uVar6 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[3] + uVar1;
  uVar2 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[2] + uVar2;
  uVar4 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[1] + uVar6;
  uVar1 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = *key + uVar4;
  uVar2 = uVar2 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)(block + 4) = uVar2;
  *(uint *)block = uVar1 + uVar4;
  uVar5 = uVar1 + uVar4 + key[7];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 5;
  uVar4 = uVar4 + uVar5;
  *(uint *)(block + 0xc) = uVar4;
  uVar1 = uVar1 - uVar5;
  *(uint *)block = uVar1;
  uVar5 = key[6] + uVar1;
  uVar6 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[5] + uVar2;
  uVar4 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[4] + uVar6;
  uVar1 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[3] + uVar1;
  uVar2 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[2] + uVar4;
  uVar6 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[1] + uVar2;
  uVar1 = uVar1 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)block = uVar1;
  *(uint *)(block + 8) = uVar6 + uVar2;
  uVar5 = uVar6 + uVar2 + *key;
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 4;
  uVar2 = uVar2 + uVar5;
  *(uint *)(block + 4) = uVar2;
  uVar6 = uVar6 - uVar5;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[7] + uVar6;
  uVar4 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[6] + uVar1;
  uVar2 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[5] + uVar4;
  uVar6 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[4] + uVar6;
  uVar1 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[3] + uVar2;
  uVar4 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[2] + uVar1;
  uVar6 = uVar6 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)(block + 8) = uVar6;
  *(uint *)(block + 0xc) = uVar4 + uVar1;
  uVar5 = uVar4 + uVar1 + key[1];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 3;
  uVar1 = uVar1 + uVar5;
  *(uint *)block = uVar1;
  uVar4 = uVar4 - uVar5;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = *key + uVar4;
  uVar2 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[7] + uVar6;
  uVar1 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[6] + uVar2;
  uVar4 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[5] + uVar4;
  uVar6 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[4] + uVar1;
  uVar2 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[3] + uVar6;
  uVar4 = uVar4 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(uint *)(block + 0xc) = uVar4;
  *(uint *)(block + 4) = uVar2 + uVar6;
  uVar5 = uVar2 + uVar6 + key[2];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 2;
  uVar6 = uVar6 + uVar5;
  *(uint *)(block + 8) = uVar6;
  uVar2 = uVar2 - uVar5;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[1] + uVar2;
  uVar1 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar1;
  *(uint *)block = uVar1;
  uVar5 = *key + uVar4;
  uVar6 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar6;
  *(uint *)(block + 8) = uVar6;
  uVar5 = key[7] + uVar1;
  uVar2 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar2;
  *(uint *)(block + 4) = uVar2;
  uVar5 = key[6] + uVar2;
  uVar4 = H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = key[5] + uVar6;
  uVar1 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar5 = key[4] + uVar4;
  iVar3 = uVar2 - (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]);
  *(int *)(block + 4) = iVar3;
  *(uint *)block = uVar1 + uVar4;
  uVar5 = uVar1 + uVar4 + key[3];
  uVar5 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ 1;
  uVar4 = uVar4 + uVar5;
  *(uint *)(block + 0xc) = uVar4;
  uVar1 = uVar1 - uVar5;
  *(uint *)block = uVar1;
  uVar5 = key[2] + uVar1;
  iVar7 = (H21[uVar5 >> 8 & 0xff] ^ H13[uVar5 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H5[uVar5 >> 0x18]) + uVar6;
  *(int *)(block + 8) = iVar7;
  uVar5 = key[1] + iVar3;
  uVar4 = H21[uVar5 & 0xff] ^ H29[uVar5 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H13[uVar5 >> 0x18] ^ uVar4;
  *(uint *)(block + 0xc) = uVar4;
  uVar5 = *key + iVar7;
  *(u32 *)(block + 4) =
       H5[uVar5 & 0xff] ^ H13[uVar5 >> 8 & 0xff] ^
       *(uint *)((long)H21 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ H29[uVar5 >> 0x18] ^ uVar1;
  *(uint *)(block + 8) = uVar4;
  *(int *)(block + 0xc) = iVar3;
  *(int *)block = iVar7;
  return;
}

Assistant:

void beltBlockDecr(octet block[16], const u32 key[8])
{
	u32* t = (u32*)block;
	ASSERT(memIsDisjoint2(block, 16, key, 32));
#if (OCTET_ORDER == BIG_ENDIAN)
	t[0] = u32Rev(t[0]);
	t[1] = u32Rev(t[1]);
	t[2] = u32Rev(t[2]);
	t[3] = u32Rev(t[3]);
#endif
	D((t + 0), (t + 1), (t + 2), (t + 3), key);
#if (OCTET_ORDER == BIG_ENDIAN)
	t[3] = u32Rev(t[3]);
	t[2] = u32Rev(t[2]);
	t[1] = u32Rev(t[1]);
	t[0] = u32Rev(t[0]);
#endif
}